

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall glslang::TType::copyArraySizes(TType *this,TArraySizes *s)

{
  TPoolAllocator *this_00;
  TArraySizes *this_01;
  
  this_00 = GetThreadPoolAllocator();
  this_01 = (TArraySizes *)TPoolAllocator::allocate(this_00,0x18);
  (this_01->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00b092a0;
  (this_01->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
  this_01->implicitArraySize = 0;
  this_01->implicitlySized = true;
  this_01->variablyIndexed = false;
  this->arraySizes = this_01;
  this_01->implicitArraySize = s->implicitArraySize;
  this_01->variablyIndexed = s->variablyIndexed;
  TSmallArrayVector::operator=((TSmallArrayVector *)this_01,&s->sizes);
  this_01->implicitlySized = s->implicitlySized;
  return;
}

Assistant:

void copyArraySizes(const TArraySizes& s)
    {
        // For setting a fresh new set of array sizes, not yet worrying about sharing.
        arraySizes = new TArraySizes;
        *arraySizes = s;
    }